

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeStructNew<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool default_)

{
  undefined8 *puVar1;
  undefined1 local_88 [8];
  Result<wasm::Ok> type;
  Result<wasm::Ok> _val;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_88,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
             ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = &local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
               type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_28) {
      *puVar1 = CONCAT71(uStack_27,local_28);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_20;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(uStack_27,local_28);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_30;
    local_28 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = &local_28;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructNew(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       bool default_) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  if (default_) {
    return ctx.makeStructNewDefault(pos, annotations, *type);
  }
  return ctx.makeStructNew(pos, annotations, *type);
}